

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-pile.c
# Opt level: O0

void object_absorb(object *obj1,object *obj2)

{
  _Bool _Var1;
  int local_28;
  object *poStack_20;
  wchar_t total;
  object *known;
  object *obj2_local;
  object *obj1_local;
  
  poStack_20 = obj2->known;
  local_28 = (uint)obj1->number + (uint)obj2->number;
  if (obj1->kind->base->max_stack < local_28) {
    local_28 = obj1->kind->base->max_stack;
  }
  obj1->number = (uint8_t)local_28;
  known = obj2;
  obj2_local = obj1;
  object_absorb_merge(obj1,obj2);
  if (poStack_20 != (object *)0x0) {
    _Var1 = loc_is_zero((loc)poStack_20->grid);
    if (!_Var1) {
      square_excise_object((chunk *)player->cave,poStack_20->grid,poStack_20);
    }
    delist_object((chunk_conflict *)player->cave,poStack_20);
    object_delete((chunk *)player->cave,(chunk *)0x0,&stack0xffffffffffffffe0);
  }
  object_delete((chunk *)cave,(chunk *)player->cave,&known);
  return;
}

Assistant:

void object_absorb(struct object *obj1, struct object *obj2)
{
	struct object *known = obj2->known;
	int total = obj1->number + obj2->number;

	/* Add together the item counts */
	obj1->number = MIN(total, obj1->kind->base->max_stack);

	object_absorb_merge(obj1, obj2);
	if (known) {
		if (!loc_is_zero(known->grid)) {
			square_excise_object(player->cave, known->grid, known);
		}
		delist_object(player->cave, known);
		object_delete(player->cave, NULL, &known);
	}
	object_delete(cave, player->cave, &obj2);
}